

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O0

string * __thiscall
font2svg::glyph::pointlines_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  ostream *poVar1;
  int local_78;
  allocator<char> local_71;
  int j;
  string dash_mod;
  int i;
  allocator<char> local_39;
  string local_38 [32];
  glyph *local_18;
  glyph *this_local;
  
  local_18 = this;
  this_local = (glyph *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  std::__cxx11::stringstream::str((string *)&this->tmp);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::operator<<((ostream *)&this->field_0x270,"\n\n  <!-- draw straight lines between points -->")
  ;
  std::operator<<((ostream *)&this->field_0x270,"\n  <path fill=\'none\' stroke=\'green\' d=\'");
  poVar1 = std::operator<<((ostream *)&this->field_0x270,"\n   M ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->ftpoints->x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->ftpoints->y);
  std::operator<<(poVar1,"\n");
  std::operator<<((ostream *)&this->field_0x270,"\n  \'/>");
  for (dash_mod.field_2._8_4_ = 0; (int)dash_mod.field_2._8_4_ < (this->ftoutline).n_points + -1;
      dash_mod.field_2._8_4_ = dash_mod.field_2._8_4_ + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&j,"",&local_71);
    std::allocator<char>::~allocator(&local_71);
    for (local_78 = 0; local_78 < (this->ftoutline).n_contours; local_78 = local_78 + 1) {
      if (dash_mod.field_2._8_4_ == (int)this->contours[local_78]) {
        std::__cxx11::string::operator=((string *)&j," stroke-dasharray=\'3\'");
      }
    }
    std::operator<<((ostream *)&this->field_0x270,"\n  <path fill=\'none\' stroke=\'green\'");
    std::operator<<((ostream *)&this->field_0x270,(string *)&j);
    std::operator<<((ostream *)&this->field_0x270," d=\'");
    poVar1 = std::operator<<((ostream *)&this->field_0x270," M ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,this->ftpoints[(int)dash_mod.field_2._8_4_].x);
    poVar1 = std::operator<<(poVar1,",");
    std::ostream::operator<<(poVar1,this->ftpoints[(int)dash_mod.field_2._8_4_].y);
    poVar1 = std::operator<<((ostream *)&this->field_0x270," L ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,this->ftpoints
                               [(dash_mod.field_2._8_4_ + 1) % (int)(this->ftoutline).n_points].x);
    poVar1 = std::operator<<(poVar1,",");
    std::ostream::operator<<
              (poVar1,this->ftpoints[(dash_mod.field_2._8_4_ + 1) % (int)(this->ftoutline).n_points]
                      .y);
    std::operator<<((ostream *)&this->field_0x270,"\n  \'/>");
    std::__cxx11::string::~string((string *)&j);
  }
  std::__cxx11::stringstream::str();
  return __return_storage_ptr__;
}

Assistant:

std::string pointlines()  {
		tmp.str("");
		tmp << "\n\n  <!-- draw straight lines between points -->";
		tmp << "\n  <path fill='none' stroke='green' d='";
		tmp << "\n   M " << ftpoints[0].x << "," << ftpoints[0].y << "\n";
		tmp << "\n  '/>";
		for ( int i = 0 ; i < ftoutline.n_points-1 ; i++ ) {
			std::string dash_mod("");
			for (int j = 0 ; j < ftoutline.n_contours; j++ ) {
				if (i==contours[j])
					dash_mod = " stroke-dasharray='3'";
			}
			tmp << "\n  <path fill='none' stroke='green'";
			tmp << dash_mod;
			tmp << " d='";
 			tmp << " M " << ftpoints[i].x << "," << ftpoints[i].y;
 			tmp << " L " << ftpoints[(i+1)%ftoutline.n_points].x << "," << ftpoints[(i+1)%ftoutline.n_points].y;
			tmp << "\n  '/>";
		}
		return tmp.str();
	}